

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O0

void crnlib::dxt_fast::eval_colors(color_quad_u8 *pColors,uint c0,uint c1)

{
  uint in_EDX;
  uint in_ESI;
  color_quad_u8 *in_RDI;
  
  unpack_color(in_RDI,in_ESI);
  unpack_color(in_RDI + 1,in_EDX);
  in_RDI[2].field_0.field_0.r =
       (uchar)((ulong)((uint)(in_RDI->field_0).field_0.r * 2 + (uint)in_RDI[1].field_0.field_0.r) /
              3);
  in_RDI[2].field_0.field_0.g =
       (uchar)((ulong)((uint)(in_RDI->field_0).field_0.g * 2 + (uint)in_RDI[1].field_0.field_0.g) /
              3);
  in_RDI[2].field_0.field_0.b =
       (uchar)((ulong)((uint)(in_RDI->field_0).field_0.b * 2 + (uint)in_RDI[1].field_0.field_0.b) /
              3);
  in_RDI[3].field_0.field_0.r =
       (uchar)((ulong)((uint)in_RDI[1].field_0.field_0.r * 2 + (uint)(in_RDI->field_0).field_0.r) /
              3);
  in_RDI[3].field_0.field_0.g =
       (uchar)((ulong)((uint)in_RDI[1].field_0.field_0.g * 2 + (uint)(in_RDI->field_0).field_0.g) /
              3);
  in_RDI[3].field_0.field_0.b =
       (uchar)((ulong)((uint)in_RDI[1].field_0.field_0.b * 2 + (uint)(in_RDI->field_0).field_0.b) /
              3);
  return;
}

Assistant:

static inline void eval_colors(color_quad_u8* pColors, uint c0, uint c1) {
  unpack_color(pColors[0], c0);
  unpack_color(pColors[1], c1);

#if 0
         lerp_color(pColors[2], pColors[0], pColors[1], 0x55);
         lerp_color(pColors[3], pColors[0], pColors[1], 0xAA);
#else
  pColors[2].r = (pColors[0].r * 2 + pColors[1].r) / 3;
  pColors[2].g = (pColors[0].g * 2 + pColors[1].g) / 3;
  pColors[2].b = (pColors[0].b * 2 + pColors[1].b) / 3;

  pColors[3].r = (pColors[1].r * 2 + pColors[0].r) / 3;
  pColors[3].g = (pColors[1].g * 2 + pColors[0].g) / 3;
  pColors[3].b = (pColors[1].b * 2 + pColors[0].b) / 3;
#endif
}